

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

void nn_sws_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  void **ppvVar1;
  int *piVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  uint16_t uVar7;
  int iVar8;
  uint64_t size;
  nn_fsm *pnVar9;
  void *pvVar10;
  uint extraout_EDX;
  uint extraout_EDX_00;
  int extraout_EDX_01;
  char *reason;
  size_t len;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  ulong size_00;
  nn_usock *self_00;
  undefined8 uVar16;
  long lVar17;
  
  uVar13 = (ulong)(uint)src;
  size_00 = (ulong)*(uint *)&self[1].fn;
  switch(*(uint *)&self[1].fn) {
  case 1:
    if (src != -2) {
LAB_0012fadf:
      nn_sws_handler_cold_25();
LAB_0012fae8:
      nn_sws_handler_cold_7();
LAB_0012faf1:
      nn_sws_handler_cold_23();
      goto LAB_0012fafa;
    }
    if (type == -2) {
      nn_ws_handshake_start
                ((nn_ws_handshake *)&self[1].owner,(nn_usock *)self[1].srcptr,
                 (nn_pipebase *)&self[0x3d].stopped.type,self[1].src,(char *)self[0x40].srcptr,
                 (char *)self[0x40].owner);
      *(undefined4 *)&self[1].fn = 2;
      return;
    }
    goto LAB_0012fb0a;
  case 2:
    if (src != 2) goto LAB_0012faf1;
    if (type == 2) goto LAB_0012f54b;
    if (type == 1) {
      nn_ws_handshake_stop((nn_ws_handshake *)&self[1].owner);
      *(undefined4 *)&self[1].fn = 3;
      return;
    }
    goto LAB_0012fb1f;
  case 3:
    if (src != 2) {
LAB_0012fad6:
      nn_sws_handler_cold_21();
      goto LAB_0012fadf;
    }
    if (type == 3) {
      iVar8 = nn_pipebase_start((nn_pipebase *)&self[0x3d].stopped.type);
      if (-1 < iVar8) {
        nn_sws_recv_hdr((nn_sws *)self);
        self[0x44].stopped.type = 1;
        *(undefined4 *)&self[1].fn = 4;
        return;
      }
LAB_0012f56f:
      *(undefined4 *)&self[1].fn = 7;
      iVar8 = 1;
      goto LAB_0012f585;
    }
    break;
  case 4:
    if (src != 1) goto LAB_0012fae8;
    switch(type) {
    case 3:
      if (self[0x44].stopped.type == 2) {
        self[0x44].stopped.type = 1;
        nn_msg_term((nn_msg *)&self[0x45].shutdown_fn);
        nn_msg_init((nn_msg *)&self[0x45].shutdown_fn,0);
        nn_pipebase_sent((nn_pipebase *)&self[0x3d].stopped.type);
        return;
      }
LAB_0012fac3:
      nn_sws_handler_cold_19();
LAB_0012fac8:
      nn_sws_handler_cold_10();
      goto LAB_0012facd;
    case 4:
      iVar8 = *(int *)&self[0x40].ctx;
      if (iVar8 == 3) {
        if ((self[0x40].stopped.field_0xc != '\0') &&
           (uVar6 = *(ulong *)&self[0x41].stopped.src, uVar6 != 0)) {
          pvVar10 = self[0x40].stopped.srcptr;
          pnVar9 = self[0x41].stopped.fsm;
          uVar13 = 0;
          do {
            pbVar3 = (byte *)((long)&pnVar9->fn + uVar13);
            *pbVar3 = *pbVar3 ^ *(byte *)((long)pvVar10 + (ulong)((uint)uVar13 & 3));
            uVar13 = uVar13 + 1;
            size_00 = uVar13 & 0xffffffff;
          } while (size_00 < uVar6);
        }
        uVar12 = (uint)uVar13;
        switch(*(undefined1 *)((long)&self[0x40].stopped.src + 2)) {
        case 0:
          if ((self[0x41].stopped.field_0x1c & 0xf) == 1) goto switchD_0012f661_caseD_1;
        case 2:
          if (*(int *)&self[0x40].stopped.item.next == 0) {
LAB_0012fa00:
            nn_sws_recv_hdr((nn_sws *)self);
            return;
          }
LAB_0012f755:
          *(undefined4 *)&self[0x40].ctx = 4;
LAB_0012f84e:
          nn_pipebase_received((nn_pipebase *)&self[0x3d].stopped.type);
          return;
        case 1:
switchD_0012f661_caseD_1:
          nn_sws_validate_utf8_chunk((nn_sws *)self);
          return;
        case 8:
          if (1 < *(ulong *)&self[0x41].stopped.src) goto LAB_0012f7d2;
          nn_sws_handler_cold_8();
LAB_0012f773:
          size = nn_getll((uint8_t *)((long)&self[0x40].ctx + 6));
          lVar17 = 0x1636;
LAB_0012f787:
          *(uint64_t *)&self[0x41].stopped.src = size;
          pvVar10 = (void *)0x0;
          if (self[0x40].stopped.field_0xc != '\0') {
            pvVar10 = (void *)((long)&self->fn + lVar17);
          }
          self[0x40].stopped.srcptr = pvVar10;
          if (size == 0) {
            if (*(int *)&self[0x40].stopped.item.next == 0) goto LAB_0012fa00;
            if (*(char *)((long)&self[0x40].stopped.src + 2) == '\b') {
LAB_0012f7d2:
              nn_pipebase_stop((nn_pipebase *)&self[0x3d].stopped.type);
              *(undefined4 *)&self[1].fn = 5;
              return;
            }
            *(uint *)&self[0x40].ctx =
                 5 - (uint)(*(int *)((long)&self[0x40].stopped.item.next + 4) == 0);
            goto LAB_0012f84e;
          }
          if (*(int *)((long)&self[0x40].stopped.item.next + 4) == 0) {
            piVar2 = &self[0x41].stopped.type;
            *piVar2 = *piVar2 + 1;
            ppvVar1 = &self[0x41].stopped.srcptr;
            *ppvVar1 = (void *)((long)*ppvVar1 + size);
            pnVar9 = (nn_fsm *)nn_msg_chunk_new(size,(nn_list *)&self[0x41].owner);
          }
          else {
            pnVar9 = (nn_fsm *)&self[0x41].stopped.field_0x1d;
          }
          self[0x41].stopped.fsm = pnVar9;
          *(undefined4 *)&self[0x40].ctx = 3;
LAB_0012f817:
          self_00 = (nn_usock *)self[1].srcptr;
          len = *(size_t *)&self[0x41].stopped.src;
LAB_0012f822:
          nn_usock_recv(self_00,pnVar9,len,(int *)0x0);
          return;
        case 9:
        case 10:
switchD_0012f661_caseD_9:
          *(undefined4 *)&self[0x40].ctx = 5;
          goto LAB_0012f84e;
        }
        goto switchD_0012f661_caseD_3;
      }
      if (iVar8 == 2) {
        if (*(long *)&self[0x40].stopped.type != 0) {
          bVar4 = *(byte *)((long)&self[0x40].stopped.src + 3);
          size = (uint64_t)bVar4;
          if (size < 0x7e) {
            lVar17 = 0x162e;
          }
          else {
            if (size == 0x7f) goto LAB_0012f773;
            if (bVar4 != 0x7e) {
              reason = "Invalid payload length.";
              goto LAB_0012f86b;
            }
            uVar7 = nn_gets((uint8_t *)((long)&self[0x40].ctx + 6));
            size = (uint64_t)uVar7;
            lVar17 = 0x1630;
          }
          goto LAB_0012f787;
        }
        goto LAB_0012fac8;
      }
      uVar12 = 1;
      if (iVar8 != 1) goto LAB_0012fb4d;
      bVar4 = *(byte *)((long)&self[0x40].ctx + 4);
      if ((bVar4 & 0x70) != 0) {
        reason = "RSV1, RSV2, and RSV3 must be unset.";
        goto LAB_0012f86b;
      }
      *(uint *)&self[0x40].stopped.item.next = bVar4 & 0xffffff80;
      bVar14 = *(byte *)((long)&self[0x40].ctx + 5);
      size_00 = (ulong)bVar14;
      uVar12 = (uint)(size_00 & 0xffffffffffffff80);
      cVar11 = (char)(size_00 & 0xffffffffffffff80);
      self[0x40].stopped.field_0xc = cVar11;
      iVar8 = self[1].src;
      if (iVar8 == 1) {
        if (cVar11 != '\0') {
          reason = "Client expects MASK bit to be unset.";
          goto LAB_0012f86b;
        }
        uVar16 = 0;
LAB_0012f6f1:
        *(undefined8 *)&self[0x40].stopped.type = uVar16;
        uVar12 = bVar4 & 0xf;
        *(char *)((long)&self[0x40].stopped.src + 2) = (char)uVar12;
        uVar15 = bVar14 & 0x7f;
        size_00 = (ulong)uVar15;
        bVar14 = (byte)uVar15;
        *(byte *)((long)&self[0x40].stopped.src + 3) = bVar14;
        iVar5 = *(int *)&self[0x41].fn;
        if ((bVar4 & 0xf) == 0 && iVar5 == 0) {
          reason = "No message to continue.";
          goto LAB_0012f86b;
        }
        if (iVar5 == 0) {
          self[0x41].stopped.field_0x1c = bVar4 | 0x80;
        }
        if (0x7d < bVar14) {
          lVar17 = 2;
          if (bVar14 != 0x7e) {
            if (uVar15 != 0x7f) goto LAB_0012fb5c;
            lVar17 = 8;
          }
          piVar2 = &self[0x40].stopped.type;
          *(long *)piVar2 = *(long *)piVar2 + lVar17;
        }
        if (10 < uVar12) {
switchD_0012f8d4_caseD_3:
          reason = "Invalid opcode.";
          goto LAB_0012f86b;
        }
        src = (&switchD_0012f8d4::switchdataD_001359fc)[uVar12] + 0x1359fc;
        switch(uVar12) {
        case 0:
          *(undefined4 *)((long)&self[0x40].stopped.item.next + 4) = 0;
          *(uint *)&self[0x41].fn = bVar4 >> 7 ^ 1;
          if ((*(long *)&self[0x40].stopped.type != 0) || (bVar14 != 0)) goto LAB_0012fa2e;
          if (iVar8 == 1) {
            *(undefined8 *)&self[0x41].stopped.src = 0;
            if (-1 < (char)bVar4) goto LAB_0012fa00;
            goto LAB_0012f755;
          }
          goto LAB_0012fb2d;
        case 1:
        case 2:
          *(undefined4 *)((long)&self[0x40].stopped.item.next + 4) = 0;
          if (iVar5 != 0) {
            reason = "Expected continuation frame opcode.";
            goto LAB_0012f86b;
          }
          if ((bVar4 & 0x80) == 0) {
            *(undefined4 *)&self[0x41].fn = 1;
          }
          if ((*(long *)&self[0x40].stopped.type != 0) || (bVar14 != 0)) goto LAB_0012fa2e;
          uVar12 = src;
          if (iVar8 == 1) {
            *(undefined8 *)&self[0x41].stopped.src = 0;
            if (*(int *)&self[0x41].fn != 0) goto LAB_0012fa00;
            goto LAB_0012f755;
          }
          goto LAB_0012fb48;
        default:
          goto switchD_0012f8d4_caseD_3;
        case 8:
          *(undefined4 *)((long)&self[0x40].stopped.item.next + 4) = 1;
          if ((bVar4 & 0x80) == 0) goto LAB_0012f9b6;
          if (0x7d < bVar14) goto LAB_0012f9a6;
          if (bVar14 == 1) {
            reason = "Expected 2byte close code.";
            goto LAB_0012f86b;
          }
          goto LAB_0012fa0f;
        case 9:
          *(undefined4 *)((long)&self[0x40].stopped.item.next + 4) = 1;
          *(int *)&self[0x41].srcptr = *(int *)&self[0x41].srcptr + 1;
          break;
        case 10:
          *(undefined4 *)((long)&self[0x40].stopped.item.next + 4) = 1;
          piVar2 = (int *)((long)&self[0x41].srcptr + 4);
          *piVar2 = *piVar2 + 1;
        }
        if (0x7d < bVar14) {
LAB_0012f9a6:
          reason = "Control frame payload exceeds allowable length.";
LAB_0012f86b:
          nn_sws_fail_conn((nn_sws *)self,0x3ea,reason);
          return;
        }
        if ((bVar4 & 0x80) == 0) {
LAB_0012f9b6:
          reason = "Cannot fragment control message (FIN=0).";
          goto LAB_0012f86b;
        }
LAB_0012fa0f:
        if ((bVar14 == 0) && (*(long *)&self[0x40].stopped.type == 0)) {
          *(undefined8 *)&self[0x41].stopped.src = 0;
          goto switchD_0012f661_caseD_9;
        }
LAB_0012fa2e:
        len = *(size_t *)&self[0x40].stopped.type;
        if (len != 0) {
          *(undefined4 *)&self[0x40].ctx = 2;
          self_00 = (nn_usock *)self[1].srcptr;
          pnVar9 = (nn_fsm *)((long)&self[0x40].ctx + 6);
          goto LAB_0012f822;
        }
        if (iVar8 != 1) goto LAB_0012fb32;
        if (0x7d < bVar14) goto LAB_0012fb37;
        if (bVar14 != 0) {
          *(undefined4 *)&self[0x40].ctx = 3;
          *(ulong *)&self[0x41].stopped.src = size_00;
          if (*(int *)((long)&self[0x40].stopped.item.next + 4) == 0) {
            piVar2 = &self[0x41].stopped.type;
            *piVar2 = *piVar2 + 1;
            ppvVar1 = &self[0x41].stopped.srcptr;
            *ppvVar1 = (void *)((long)*ppvVar1 + size_00);
            pnVar9 = (nn_fsm *)nn_msg_chunk_new(size_00,(nn_list *)&self[0x41].owner);
          }
          else {
            pnVar9 = (nn_fsm *)&self[0x41].stopped.field_0x1d;
          }
          self[0x41].stopped.fsm = pnVar9;
          goto LAB_0012f817;
        }
        goto LAB_0012fb3c;
      }
      if (iVar8 == 2) {
        uVar16 = 4;
        if (cVar11 == '\0') {
          reason = "Server expects MASK bit to be set.";
          goto LAB_0012f86b;
        }
        goto LAB_0012f6f1;
      }
      break;
    case 5:
      nn_pipebase_stop((nn_pipebase *)&self[0x3d].stopped.type);
      goto LAB_0012f56f;
    default:
      goto switchD_0012f4c5_caseD_6;
    case 8:
      nn_pipebase_stop((nn_pipebase *)&self[0x3d].stopped.type);
      *(undefined4 *)&self[1].fn = 6;
      return;
    }
    goto LAB_0012fb52;
  case 5:
    if (src != 1) {
LAB_0012facd:
      nn_sws_handler_cold_4();
      goto LAB_0012fad6;
    }
    if (type == 8) {
      return;
    }
    if (type == 5) goto LAB_0012f56f;
    if (type == 3) {
      if (self[0x44].stopped.type != 2) {
        nn_sws_handler_cold_5();
        goto LAB_0012fac3;
      }
      self[0x44].stopped.type = 1;
      goto LAB_0012f54b;
    }
    goto LAB_0012fb26;
  case 6:
    if (src == 1) {
      if (type == 5) goto LAB_0012f56f;
      nn_sws_handler_cold_3();
LAB_0012f54b:
      *(undefined4 *)&self[1].fn = 7;
      iVar8 = 2;
LAB_0012f585:
      nn_fsm_raise(self,(nn_fsm_event *)&self[0x46].state,iVar8);
      return;
    }
LAB_0012fafa:
    nn_sws_handler_cold_2();
    break;
  case 7:
    goto switchD_0012f3d9_caseD_7;
  default:
    goto switchD_0012f3d9_default;
  }
  nn_sws_handler_cold_22();
LAB_0012fb0a:
  nn_sws_handler_cold_26();
  type = extraout_EDX;
switchD_0012f3d9_caseD_7:
  src = type;
  nn_sws_handler_cold_1();
switchD_0012f3d9_default:
  nn_sws_handler_cold_27();
LAB_0012fb1f:
  nn_sws_handler_cold_24();
LAB_0012fb26:
  nn_sws_handler_cold_6();
LAB_0012fb2d:
  nn_sws_handler_cold_12();
LAB_0012fb32:
  nn_sws_handler_cold_13();
LAB_0012fb37:
  nn_sws_handler_cold_15();
LAB_0012fb3c:
  nn_sws_handler_cold_14();
  type = extraout_EDX_00;
switchD_0012f4c5_caseD_6:
  size_00 = (ulong)(uint)type;
  nn_sws_handler_cold_20();
  uVar12 = src;
LAB_0012fb48:
  nn_sws_handler_cold_16();
LAB_0012fb4d:
  nn_sws_handler_cold_18();
LAB_0012fb52:
  nn_sws_handler_cold_17();
switchD_0012f661_caseD_3:
  nn_sws_handler_cold_9();
LAB_0012fb5c:
  nn_sws_handler_cold_11();
  if (extraout_EDX_01 == -3 && uVar12 == 0xfffffffe) goto LAB_0012fb8c;
  while (*(int *)(size_00 + 0x58) != 8) {
    nn_sws_shutdown_cold_2();
LAB_0012fb8c:
    nn_sws_shutdown_cold_1();
  }
  nn_sws_shutdown_cold_3();
  return;
}

Assistant:

static void nn_sws_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_sws *sws;
    int rc;

    sws = nn_cont (self, struct nn_sws, fsm);

    switch (sws->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_SWS_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_ws_handshake_start (&sws->handshaker, sws->usock,
                    &sws->pipebase, sws->mode, sws->resource, sws->remote_host);
                sws->state = NN_SWS_STATE_HANDSHAKE;
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  HANDSHAKE state.                                                          */
/******************************************************************************/
    case NN_SWS_STATE_HANDSHAKE:
        switch (src) {

        case NN_SWS_SRC_HANDSHAKE:
            switch (type) {
            case NN_WS_HANDSHAKE_OK:

                /*  Before moving to the active state stop the handshake
                    state machine. */
                nn_ws_handshake_stop (&sws->handshaker);
                sws->state = NN_SWS_STATE_STOPPING_HANDSHAKE;
                return;

            case NN_WS_HANDSHAKE_ERROR:

                /* Raise the error and move directly to the DONE state.
                   ws_handshake object will be stopped later on. */
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done,
                    NN_SWS_RETURN_CLOSE_HANDSHAKE);
                return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_HANDSHAKE state.                                                 */
/******************************************************************************/
    case NN_SWS_STATE_STOPPING_HANDSHAKE:
        switch (src) {

        case NN_SWS_SRC_HANDSHAKE:
            switch (type) {
            case NN_WS_HANDSHAKE_STOPPED:

                 /*  Start the pipe. */
                 rc = nn_pipebase_start (&sws->pipebase);
                 if (nn_slow (rc < 0)) {
                    sws->state = NN_SWS_STATE_DONE;
                    nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                    return;
                 }

                 /*  Start receiving a message in asynchronous manner. */
                 nn_sws_recv_hdr (sws);

                 /*  Mark the pipe as available for sending. */
                 sws->outstate = NN_SWS_OUTSTATE_IDLE;

                 sws->state = NN_SWS_STATE_ACTIVE;
                 return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_SWS_STATE_ACTIVE:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:

                /*  The message is now fully sent. */
                nn_assert (sws->outstate == NN_SWS_OUTSTATE_SENDING);
                sws->outstate = NN_SWS_OUTSTATE_IDLE;
                nn_msg_term (&sws->outmsg);
                nn_msg_init (&sws->outmsg, 0);
                nn_pipebase_sent (&sws->pipebase);
                return;

            case NN_USOCK_RECEIVED:

                switch (sws->instate) {
                case NN_SWS_INSTATE_RECV_HDR:

                    /*  Require RSV1, RSV2, and RSV3 bits to be unset for
                        x-nanomsg protocol as per RFC 6455 section 5.2. */
                    if (sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV1 ||
                        sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV2 ||
                        sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV3) {
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                            "RSV1, RSV2, and RSV3 must be unset.");
                        return;
                    }

                    sws->is_final_frame = sws->inhdr [0] &
                        NN_SWS_FRAME_BITMASK_FIN;
                    sws->masked = sws->inhdr [1] &
                        NN_SWS_FRAME_BITMASK_MASKED;

                    switch (sws->mode) {
                    case NN_WS_SERVER:
                        /*  Require mask bit to be set from client. */
                        if (sws->masked) {
                            /*  Continue receiving header for this frame. */
                            sws->ext_hdr_len = NN_SWS_FRAME_SIZE_MASK;
                            break;
                        }
                        else {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Server expects MASK bit to be set.");
                            return;
                        }
                    case NN_WS_CLIENT:
                        /*  Require mask bit to be unset from server. */
                        if (sws->masked) {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Client expects MASK bit to be unset.");
                            return;
                        }
                        else {
                            /*  Continue receiving header for this frame. */
                            sws->ext_hdr_len = 0;
                            break;
                        }
                    default:
                        /*  Only two modes of this endpoint are expected. */
                        nn_assert (0);
                        return;
                    }

                    sws->opcode = sws->inhdr [0] &
                        NN_SWS_FRAME_BITMASK_OPCODE;
                    sws->payload_ctl = sws->inhdr [1] &
                        NN_SWS_FRAME_BITMASK_LENGTH;

                    /*  Prevent unexpected continuation frame. */
                    if (!sws->continuing &&
                        sws->opcode == NN_WS_OPCODE_FRAGMENT) {
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                            "No message to continue.");
                        return;
                    }

                    /*  Preserve initial message opcode and RSV bits in case
                        this is a fragmented message. */
                    if (!sws->continuing)
                        sws->inmsg_hdr = sws->inhdr [0] |
                        NN_SWS_FRAME_BITMASK_FIN;

                    if (sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_0;
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_16) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_16;
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_63) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_63;
                    }
                    else {
                        /*  Developer error parsing/handling length. */
                        nn_assert (0);
                        return;
                    }

                    switch (sws->opcode) {

                    case NN_WS_OPCODE_TEXT:
                        /*  Fall thru; TEXT and BINARY handled alike. */
                    case NN_WS_OPCODE_BINARY:

                        sws->is_control_frame = 0;

                        if (sws->continuing) {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Expected continuation frame opcode.");
                            return;
                        }

                        if (!sws->is_final_frame)
                            sws->continuing = 1;

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Only a remote server could send a 2-byte msg;
                                sanity-check that this endpoint is a client. */
                            nn_assert (sws->mode == NN_WS_CLIENT);

                            sws->inmsg_current_chunk_len = 0;

                            if (sws->continuing) {
                                /*  This frame was empty, but continue
                                    next frame in fragmented sequence. */
                                nn_sws_recv_hdr (sws);
                                return;
                            }
                            else {
                                /*  Special case when there is no payload,
                                    mask, or additional frames. */
                                sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                                nn_pipebase_received (&sws->pipebase);
                                return;
                            }
                            }
                        /*  Continue to receive extended header+payload. */
                        break;

                    case NN_WS_OPCODE_FRAGMENT:

                        sws->is_control_frame = 0;
                        sws->continuing = !sws->is_final_frame;

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Only a remote server could send a 2-byte msg;
                                sanity-check that this endpoint is a client. */
                            nn_assert (sws->mode == NN_WS_CLIENT);

                            sws->inmsg_current_chunk_len = 0;

                            if (sws->continuing) {
                                /*  This frame was empty, but continue
                                    next frame in fragmented sequence. */
                                nn_sws_recv_hdr (sws);
                                return;
                            }
                            else {
                                /*  Special case when there is no payload,
                                    mask, or additional frames. */
                                sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                                nn_pipebase_received (&sws->pipebase);
                                return;
                            }
                        }
                        /*  Continue to receive extended header+payload. */
                        break;

                    case NN_WS_OPCODE_PING:
                        sws->is_control_frame = 1;
                        sws->pings_received++;
                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                            nn_pipebase_received (&sws->pipebase);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;
                    
                    case NN_WS_OPCODE_PONG:
                        sws->is_control_frame = 1;
                        sws->pongs_received++;
                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                            nn_pipebase_received (&sws->pipebase);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;
                    
                    case NN_WS_OPCODE_CLOSE:
                        /*  RFC 6455 section 5.5.1. */
                        sws->is_control_frame = 1;
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }

                        if (sws->payload_ctl == 1) {
                            /*  As per RFC 6455 section 5.5.1, if a payload is
                                to accompany a close frame, the first two bytes
                                MUST be the close code. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Expected 2byte close code.");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                            nn_pipebase_received (&sws->pipebase);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;
                    
                    default:
                        /*  Client sent an invalid opcode; as per RFC 6455
                            section 10.7, close connection with code. */
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Invalid opcode.");
                        return;

                    }

                    if (sws->ext_hdr_len == 0) {
                        /*  Only a remote server could send a 2-byte msg;
                            sanity-check that this endpoint is a client. */
                        nn_assert (sws->mode == NN_WS_CLIENT);

                        /*  In the case of no additional header, the payload
                            is known to not exceed this threshold. */
                        nn_assert (sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH);

                        /*  In the case of no additional header, the payload
                            is known to not exceed this threshold. */
                        nn_assert (sws->payload_ctl > 0);

                        sws->instate = NN_SWS_INSTATE_RECV_PAYLOAD;
                        sws->inmsg_current_chunk_len = sws->payload_ctl;


                        /*  Use scatter/gather array for application messages,
                            and a fixed-width buffer for control messages. This
                            is convenient since control messages can be
                            interspersed between chunked application msgs. */
                        if (sws->is_control_frame) {
                            sws->inmsg_current_chunk_buf = sws->inmsg_control;
                        }
                        else {
                            sws->inmsg_chunks++;
                            sws->inmsg_total_size += sws->inmsg_current_chunk_len;
                            sws->inmsg_current_chunk_buf =
                                nn_msg_chunk_new (sws->inmsg_current_chunk_len,
                                &sws->inmsg_array);
                        }

                        nn_usock_recv (sws->usock, sws->inmsg_current_chunk_buf,
                            sws->inmsg_current_chunk_len, NULL);
                        return;
                    }
                    else {
                        /*  Continue receiving the rest of the header frame. */
                        sws->instate = NN_SWS_INSTATE_RECV_HDREXT;
                        nn_usock_recv (sws->usock,
                            sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL,
                            sws->ext_hdr_len,
                            NULL);
                        return;
                    }

                case NN_SWS_INSTATE_RECV_HDREXT:
                    nn_assert (sws->ext_hdr_len > 0);

                    if (sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH) {
                        sws->inmsg_current_chunk_len = sws->payload_ctl;
                        if (sws->masked) {
                            sws->mask = sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_16) {
                        sws->inmsg_current_chunk_len =
                            nn_gets (sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL);
                        if (sws->masked) {
                            sws->mask = sws->inhdr +
                                NN_SWS_FRAME_SIZE_INITIAL +
                                NN_SWS_FRAME_SIZE_PAYLOAD_16;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_63) {
                        sws->inmsg_current_chunk_len =
                            (size_t) nn_getll (sws->inhdr +
                            NN_SWS_FRAME_SIZE_INITIAL);
                        if (sws->masked) {
                            sws->mask = sws->inhdr +
                                NN_SWS_FRAME_SIZE_INITIAL +
                                NN_SWS_FRAME_SIZE_PAYLOAD_63;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else {
                        /*  Client sent invalid data; as per RFC 6455,
                            server closes the connection immediately. */
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Invalid payload length.");
                        return;
                    }

                    /*  Handle zero-length message bodies. */
                    if (sws->inmsg_current_chunk_len == 0)
                    {
                        if (sws->is_final_frame) {
                           if (sws->opcode == NN_WS_OPCODE_CLOSE) {
                             nn_pipebase_stop (&sws->pipebase);
                             sws->state = NN_SWS_STATE_CLOSING_CONNECTION;
                            }
                            else
                            { 
                              sws->instate = (sws->is_control_frame ?
                                  NN_SWS_INSTATE_RECVD_CONTROL :
                                  NN_SWS_INSTATE_RECVD_CHUNKED);
                              nn_pipebase_received (&sws->pipebase);
                            }
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
			return;
                    }

                    nn_assert (sws->inmsg_current_chunk_len > 0);

                    /*  Use scatter/gather array for application messages,
                        and a fixed-width buffer for control messages. This
                        is convenient since control messages can be
                        interspersed between chunked application msgs. */
                    if (sws->is_control_frame) {
                        sws->inmsg_current_chunk_buf = sws->inmsg_control;
                    }
                    else {
                        sws->inmsg_chunks++;
                        sws->inmsg_total_size += sws->inmsg_current_chunk_len;
                        sws->inmsg_current_chunk_buf =
                            nn_msg_chunk_new (sws->inmsg_current_chunk_len,
                            &sws->inmsg_array);
                    }

                    sws->instate = NN_SWS_INSTATE_RECV_PAYLOAD;
                    nn_usock_recv (sws->usock, sws->inmsg_current_chunk_buf,
                        sws->inmsg_current_chunk_len, NULL);
                    return;

                case NN_SWS_INSTATE_RECV_PAYLOAD:

                    /*  Unmask if necessary. */
                    if (sws->masked) {
                        nn_sws_mask_payload (sws->inmsg_current_chunk_buf,
                            sws->inmsg_current_chunk_len, sws->mask,
                            NN_SWS_FRAME_SIZE_MASK, NULL);
                    }

                    switch (sws->opcode) {

                    case NN_WS_OPCODE_TEXT:
                        nn_sws_validate_utf8_chunk (sws);
                        return;

                    case NN_WS_OPCODE_BINARY:
                        if (sws->is_final_frame) {
                            sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                            nn_pipebase_received (&sws->pipebase);
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
                        return;

                    case NN_WS_OPCODE_FRAGMENT:
                        /*  Must check original opcode to see if this fragment
                            needs UTF-8 validation. */
                        if ((sws->inmsg_hdr & NN_SWS_FRAME_BITMASK_OPCODE) ==
                            NN_WS_OPCODE_TEXT) {
                            nn_sws_validate_utf8_chunk (sws);
                        }
                        else if (sws->is_final_frame) {
                            sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                            nn_pipebase_received (&sws->pipebase);
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
                        return;

                    case NN_WS_OPCODE_PING:
                        sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                        nn_pipebase_received (&sws->pipebase);
                        return;

                    case NN_WS_OPCODE_PONG:
                        sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                        nn_pipebase_received (&sws->pipebase);
                        return;

                    case NN_WS_OPCODE_CLOSE:
                        /*  If the payload is not even long enough for the
                            required 2-octet Close Code, the connection
                            should have been failed upstream. */
                        nn_assert (sws->inmsg_current_chunk_len >=
                            NN_SWS_CLOSE_CODE_LEN);
                        
                        nn_pipebase_stop (&sws->pipebase);
                        sws->state = NN_SWS_STATE_CLOSING_CONNECTION;
                        return;

                    default:
                        /*  This should have been prevented upstream. */
                        nn_assert (0);
                        return;
                    } 

                default:
                    nn_fsm_error ("Unexpected socket instate",
                        sws->state, src, type);
                }

            case NN_USOCK_SHUTDOWN:
                nn_pipebase_stop (&sws->pipebase);
                sws->state = NN_SWS_STATE_BROKEN_CONNECTION;
                return;

            case NN_USOCK_ERROR:
                nn_pipebase_stop (&sws->pipebase);
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

            break;

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  CLOSING_CONNECTION state.                                                 */
/*  Wait for acknowledgement closing handshake was successfully sent.         */
/******************************************************************************/
    case NN_SWS_STATE_CLOSING_CONNECTION:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  Wait for acknowledgement closing handshake was sent
                    to peer. */
                nn_assert (sws->outstate == NN_SWS_OUTSTATE_SENDING);
                sws->outstate = NN_SWS_OUTSTATE_IDLE;
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done,
                    NN_SWS_RETURN_CLOSE_HANDSHAKE);
                return;
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_ERROR:
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  SHUTTING_DOWN state.                                                      */
/*  The underlying connection is closed. We are just waiting that underlying  */
/*  usock being closed                                                        */
/******************************************************************************/
    case NN_SWS_STATE_BROKEN_CONNECTION:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ERROR:
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The underlying connection is closed. There's nothing that can be done in  */
/*  this state except stopping the object.                                    */
/******************************************************************************/
    case NN_SWS_STATE_DONE:
        nn_fsm_bad_source (sws->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (sws->state, src, type);
    }
}